

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::DelFromShadyLeftObjects
          (SimpleLeftObjectsDetector *this,uint obj_uid)

{
  const_iterator __position;
  list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_> *this_00;
  
  this_00 = &this->shady_left_objects;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      return;
    }
  } while (*(uint *)((long)&__position._M_node[2]._M_next + 4) != obj_uid);
  std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::erase
            (this_00,__position);
  return;
}

Assistant:

void SimpleLeftObjectsDetector::DelFromShadyLeftObjects(
        unsigned int obj_uid
        )
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end(); ++iter)
    {
        if (iter->obj_uid == obj_uid)
        {
            iter = shady_left_objects.erase(iter);
            return;
        }
    }
}